

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackArchiveGenerator::GetArchiveComponentFileName
          (string *__return_storage_ptr__,cmCPackArchiveGenerator *this,string *component,
          bool isGroupName)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0 [32];
  string local_190 [38];
  allocator<char> local_16a;
  allocator<char> local_169;
  string local_168;
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_49;
  undefined1 local_48 [8];
  string componentUpper;
  bool isGroupName_local;
  string *component_local;
  cmCPackArchiveGenerator *this_local;
  string *packageFileName;
  
  componentUpper.field_2._M_local_buf[0xf] = isGroupName;
  cmsys::SystemTools::UpperCase((string *)local_48,component);
  local_49 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_90,"CPACK_ARCHIVE_",(string *)local_48);
  std::operator+(&local_70,&local_90,"_FILE_NAME");
  bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar1) {
    std::operator+(&local_e0,"CPACK_ARCHIVE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_c0,&local_e0,"_FILE_NAME");
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_c0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar3);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"CPACK_ARCHIVE_FILE_NAME",&local_101);
    bVar1 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"CPACK_ARCHIVE_FILE_NAME",&local_169);
      pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_168);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_148,pcVar3,&local_16a);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (local_128,this,local_148,component,
                 (ulong)((byte)componentUpper.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_128);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_16a);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"CPACK_PACKAGE_FILE_NAME",&local_1d1);
      pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b0,pcVar3,&local_1d2);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (local_190,this,local_1b0,component,
                 (ulong)((byte)componentUpper.field_2._M_local_buf[0xf] & 1));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_190);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1d2);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
    }
  }
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(char *)CONCAT44(extraout_var,iVar2));
  local_49 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackArchiveGenerator::GetArchiveComponentFileName(
  const std::string& component, bool isGroupName)
{
  std::string componentUpper(cmSystemTools::UpperCase(component));
  std::string packageFileName;

  if (this->IsSet("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME")) {
    packageFileName +=
      this->GetOption("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME");
  } else if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_ARCHIVE_FILE_NAME"), component, isGroupName);
  } else {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), component, isGroupName);
  }

  packageFileName += this->GetOutputExtension();

  return packageFileName;
}